

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient> __thiscall
kj::
heap<kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient,kj::Promise<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient>>>
          (kj *this,Promise<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient>_> *params)

{
  PromiseNetworkAddressHttpClient *this_00;
  Promise<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient>_> *pPVar1;
  PromiseNetworkAddressHttpClient *extraout_RDX;
  Own<kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient> OVar2;
  Promise<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient>_> local_28;
  NoInfer<kj::Promise<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient>_>_> *local_18;
  Promise<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient>_> *params_local;
  
  local_18 = params;
  params_local = (Promise<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient>_> *)this;
  this_00 = (PromiseNetworkAddressHttpClient *)operator_new(0x30);
  pPVar1 = fwd<kj::Promise<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient>>>(local_18);
  Promise<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient>_>::Promise(&local_28,pPVar1);
  anon_unknown_31::PromiseNetworkAddressHttpClient::PromiseNetworkAddressHttpClient
            (this_00,&local_28);
  Own<kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient>::Own
            ((Own<kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient> *)this,this_00,
             (Disposer *)
             &_::HeapDisposer<kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient>::instance)
  ;
  Promise<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient>_>::~Promise(&local_28);
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}